

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O3

void __thiscall jessilib::impl::parser_manager::unregister_parser(parser_manager *this,id in_id)

{
  int iVar1;
  iterator __position;
  registration removed_registration;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)this);
  if (iVar1 != 0x23) {
    registration::registration((registration *)local_50,in_id);
    __position = std::
                 _Rb_tree<jessilib::impl::parser_manager::registration,_jessilib::impl::parser_manager::registration,_std::_Identity<jessilib::impl::parser_manager::registration>,_std::less<jessilib::impl::parser_manager::registration>,_std::allocator<jessilib::impl::parser_manager::registration>_>
                 ::find(&(this->m_registrations)._M_t,(key_type *)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)__position._M_node !=
        &(this->m_registrations)._M_t._M_impl.super__Rb_tree_header) {
      local_50 = *(undefined1 (*) [8])(__position._M_node + 1);
      local_48._M_p = (pointer)&local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,__position._M_node[1]._M_parent,
                 (long)&(__position._M_node[1]._M_parent)->_M_color +
                 (long)&(__position._M_node[1]._M_left)->_M_color);
      std::
      _Rb_tree<jessilib::impl::parser_manager::registration,jessilib::impl::parser_manager::registration,std::_Identity<jessilib::impl::parser_manager::registration>,std::less<jessilib::impl::parser_manager::registration>,std::allocator<jessilib::impl::parser_manager::registration>>
      ::erase_abi_cxx11_((_Rb_tree<jessilib::impl::parser_manager::registration,jessilib::impl::parser_manager::registration,std::_Identity<jessilib::impl::parser_manager::registration>,std::less<jessilib::impl::parser_manager::registration>,std::allocator<jessilib::impl::parser_manager::registration>>
                          *)&this->m_registrations,(const_iterator)__position._M_node);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->m_parsers)._M_h,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_p != &local_38) {
        operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
    return;
  }
  std::__throw_system_error(0x23);
}

Assistant:

void parser_manager::unregister_parser(id in_id) {
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	// Search for registration
	auto itr = m_registrations.find(registration{ in_id });
	if (itr == m_registrations.end()) {
		// Parser already unregistered; do nothing
		return;
	}

	// Unregister
	registration removed_registration = *itr;
	m_registrations.erase(itr);
	m_parsers.erase(removed_registration.m_format);
}